

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseRenderingCase::deinit(BaseRenderingCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  BaseRenderingCase *this_local;
  
  if (this->m_shader != (ShaderProgram *)0x0) {
    this_00 = this->m_shader;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
      operator_delete(this_00,0xd0);
    }
    this->m_shader = (ShaderProgram *)0x0;
  }
  if (this->m_fbo != 0) {
    pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  if (this->m_rbo != 0) {
    pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x460))(1,&this->m_rbo);
    this->m_rbo = 0;
  }
  if (this->m_texture != 0) {
    pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x480))(1,&this->m_texture);
    this->m_texture = 0;
  }
  if (this->m_blitDstFbo != 0) {
    pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x440))(1,&this->m_blitDstFbo);
    this->m_blitDstFbo = 0;
  }
  if (this->m_blitDstRbo != 0) {
    pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_03,iVar1) + 0x460))(1,&this->m_blitDstRbo);
    this->m_blitDstRbo = 0;
  }
  return;
}

Assistant:

void BaseRenderingCase::deinit (void)
{
	if (m_shader)
	{
		delete m_shader;
		m_shader = DE_NULL;
	}

	if (m_fbo)
	{
		m_context.getRenderContext().getFunctions().deleteFramebuffers(1, &m_fbo);
		m_fbo = 0;
	}

	if (m_rbo)
	{
		m_context.getRenderContext().getFunctions().deleteRenderbuffers(1, &m_rbo);
		m_rbo = 0;
	}

	if (m_texture)
	{
		m_context.getRenderContext().getFunctions().deleteTextures(1, &m_texture);
		m_texture = 0;
	}

	if (m_blitDstFbo)
	{
		m_context.getRenderContext().getFunctions().deleteFramebuffers(1, &m_blitDstFbo);
		m_blitDstFbo = 0;
	}

	if (m_blitDstRbo)
	{
		m_context.getRenderContext().getFunctions().deleteRenderbuffers(1, &m_blitDstRbo);
		m_blitDstRbo = 0;
	}
}